

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O2

addr_type __thiscall
ClrDirWrapper::containsAddrType(ClrDirWrapper *this,size_t fieldId,size_t subField)

{
  addr_type aVar1;
  IMAGE_COR20_HEADER *pIVar2;
  
  if (fieldId < 0x12) {
    if ((0x2aa88UL >> (fieldId & 0x3f) & 1) != 0) {
      return RVA;
    }
    if (fieldId == 6) {
      pIVar2 = clrDir(this);
      if (pIVar2 == (IMAGE_COR20_HEADER *)0x0) {
        aVar1 = NOT_ADDR;
      }
      else {
        aVar1 = pIVar2->Flags >> 3 & RVA;
      }
      return aVar1;
    }
  }
  return NOT_ADDR;
}

Assistant:

Executable::addr_type ClrDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case ENTRY_POINT: {
            const pe::IMAGE_COR20_HEADER* d = clrDir();
            if (!d) return Executable::NOT_ADDR;
            if (d->Flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
                return Executable::RVA;
            } else {
                return Executable::NOT_ADDR;
            }
        }
        case RESOURCES_VA: 
        case META_DATA_VA:
        case STRONG_NAME_SIGNATURE_VA:
        case CODE_MANAGER_TABLE_VA: 
        case VTABLE_FIXUPS_VA: 
        case EXPORT_ADDR_TABLE_JMPS_VA: 
        case MANAGED_NATIVE_HDR_VA: 
            return Executable::RVA;
    }
    return Executable::NOT_ADDR;
}